

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_info.cpp
# Opt level: O0

void __thiscall
duckdb::CreateViewInfo::CreateViewInfo
          (CreateViewInfo *this,SchemaCatalogEntry *schema,string *view_name)

{
  string *psVar1;
  string *in_RDX;
  CreateViewInfo *in_RSI;
  string local_88 [48];
  string local_58 [32];
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  string *catalog_p;
  
  catalog_p = in_RDX;
  psVar1 = Catalog::GetName_abi_cxx11_((Catalog *)0xedd4a5);
  ::std::__cxx11::string::string(local_38,(string *)psVar1);
  ::std::__cxx11::string::string
            (local_58,(string *)(in_RSI->super_CreateInfo).catalog.field_2._M_local_buf);
  ::std::__cxx11::string::string(local_88,(string *)in_RDX);
  CreateViewInfo(in_RSI,catalog_p,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

CreateViewInfo::CreateViewInfo(SchemaCatalogEntry &schema, string view_name)
    : CreateViewInfo(schema.catalog.GetName(), schema.name, std::move(view_name)) {
}